

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ForVariableDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ForVariableDeclarationSyntax,slang::parsing::Token&,slang::syntax::DataTypeSyntax*&,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,Token *args,DataTypeSyntax **args_1,DeclaratorSyntax *args_2)

{
  Token varKeyword;
  ForVariableDeclarationSyntax *this_00;
  DeclaratorSyntax *args_local_2;
  DataTypeSyntax **args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ForVariableDeclarationSyntax *)allocate(this,0x30,8);
  varKeyword.kind = args->kind;
  varKeyword._2_1_ = args->field_0x2;
  varKeyword.numFlags.raw = (args->numFlags).raw;
  varKeyword.rawLen = args->rawLen;
  varKeyword.info = args->info;
  slang::syntax::ForVariableDeclarationSyntax::ForVariableDeclarationSyntax
            (this_00,varKeyword,*args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }